

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

file_info * cache_get_entry(iso9660 *iso9660)

{
  file_info *pfVar1;
  file_info *file;
  iso9660 *iso9660_local;
  
  pfVar1 = (iso9660->cache_files).first;
  if ((pfVar1 != (file_info *)0x0) &&
     ((iso9660->cache_files).first = pfVar1->next, (iso9660->cache_files).first == (file_info *)0x0)
     ) {
    (iso9660->cache_files).last = &(iso9660->cache_files).first;
  }
  return pfVar1;
}

Assistant:

static inline struct file_info *
cache_get_entry(struct iso9660 *iso9660)
{
	struct file_info *file;

	if ((file = iso9660->cache_files.first) != NULL) {
		iso9660->cache_files.first = file->next;
		if (iso9660->cache_files.first == NULL)
			iso9660->cache_files.last =
			    &(iso9660->cache_files.first);
	}
	return (file);
}